

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O3

void __thiscall QMT::DES::makekey(DES *this,uint *keyleft,uint *keyright,uint number)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint (*pauVar8) [2];
  
  uVar2 = *keyleft;
  bVar1 = this->wz_lefttable[number];
  uVar3 = this->wz_leftandtab[(char)bVar1];
  uVar4 = *keyright;
  bVar5 = (long)(char)bVar1 == 1 | 0x1a;
  *keyleft = uVar2 << (bVar1 & 0x1f);
  *keyright = *keyright << (this->wz_lefttable[number] & 0x1fU);
  *keyleft = *keyleft | (uVar3 & uVar2) >> bVar5 & 0xfffffff0;
  *keyright = *keyright | (uVar3 & uVar4) >> bVar5 & 0xfffffff0;
  uVar6 = 0;
  do {
    if (uVar6 < 0x18) {
      uVar7 = uVar6;
      pauVar8 = this->g_outkey + number;
      if ((this->wz_pc2[(long)this->wz_keychoose[uVar6] + -1] & *keyleft) != 0) goto LAB_0010367e;
    }
    else if ((*(uint *)(this->wz_pc1 + (long)this->wz_keychoose[uVar6] * 4 + -0x10) & *keyright) !=
             0) {
      uVar7 = uVar6 - 0x18;
      pauVar8 = (uint (*) [2])(this->g_outkey[number] + 1);
LAB_0010367e:
      (*pauVar8)[0] = (*pauVar8)[0] | this->wz_pc2[uVar7];
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x30) {
      return;
    }
  } while( true );
}

Assistant:

void DES::makekey(unsigned int *keyleft,unsigned int *keyright ,unsigned int number)
  {
  	unsigned int tmpkey[2] ={0};
  	unsigned int *Ptmpkey = (unsigned int*)tmpkey;
  	unsigned int *Poutkey = (unsigned int*)&g_outkey[number];
  	int j;

  	InitIntArray(tmpkey, 2);

  	*Ptmpkey = *keyleft&wz_leftandtab[wz_lefttable[number]];
  	Ptmpkey[1] = *keyright&wz_leftandtab[wz_lefttable[number]];
  	if (wz_lefttable[number] == 1)
  	{
  		*Ptmpkey >>= 27;
  		Ptmpkey[1] >>= 27;
  	}
  	else
  	{
  		*Ptmpkey >>= 26;
  		Ptmpkey[1] >>= 26;
  	}
  	Ptmpkey[0] &= 0xfffffff0;
  	Ptmpkey[1] &= 0xfffffff0;

  	*keyleft <<= wz_lefttable[number];
  	*keyright <<= wz_lefttable[number];
  	*keyleft |= Ptmpkey[0];
  	*keyright |= Ptmpkey[1];
  	Ptmpkey[0] = 0;
  	//Ptmpkey[1] = 0;

  	for (j = 0; j < 48; j++)
  	{
  		if ( j >= 24 )
  	     {
  	       if ( wz_pc2[wz_keychoose[j] - 28] & *keyright ){
  					Poutkey[1] |= wz_pc2[j - 24];
  				 }

  	     }
  	     else if ( wz_pc2[wz_keychoose[j] - 1] & *keyleft )
  	     {
  	       *Poutkey |= wz_pc2[j];
  	     }
  	}

  }